

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

bool __thiscall glslang::TQualifier::hasNonXfbLayout(TQualifier *this)

{
  bool bVar1;
  undefined1 uVar2;
  
  bVar1 = hasUniformLayout(this);
  uVar2 = 1;
  if ((((!bVar1) && ((char)(*(ulong *)&this->field_0x1c >> 0x38) == -1)) &&
      ((*(ulong *)&this->field_0x1c & 0xff000000007fff) == 0xff000000004fff)) &&
     (((this->field_0x2c == '\0' && (this->layoutShaderRecord == false)) &&
      (this->layoutPushConstant == false)))) {
    uVar2 = this->layoutBufferReference;
  }
  return (bool)uVar2;
}

Assistant:

bool hasNonXfbLayout() const
    {
        return hasUniformLayout() ||
               hasAnyLocation() ||
               hasStream() ||
               hasFormat() ||
               isShaderRecord() ||
               isPushConstant() ||
               hasBufferReference();
    }